

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char * decodeText(char *src)

{
  int iVar1;
  char *pcVar2;
  char *pcStack_30;
  char c;
  char *d;
  char *dst;
  char *s;
  int len;
  char *src_local;
  
  s._4_4_ = 0;
  for (dst = src; *dst != '\0'; dst = dst + 1) {
    if (*dst == '\\') {
      iVar1 = isdigit((int)dst[1]);
      if (iVar1 == 0) {
        dst = dst + 1;
      }
      else {
        dst = dst + 3;
      }
    }
    s._4_4_ = s._4_4_ + 1;
  }
  pcVar2 = (char *)malloc((long)(s._4_4_ + 1));
  pcStack_30 = pcVar2;
  for (dst = src; *dst != '\0'; dst = dst + 1) {
    if (*dst == '\\') {
      if (dst[1] == '\\') {
        *pcStack_30 = '\\';
        dst = dst + 1;
        pcStack_30 = pcStack_30 + 1;
      }
      else if (dst[1] == 'n') {
        *pcStack_30 = '\n';
        dst = dst + 1;
        pcStack_30 = pcStack_30 + 1;
      }
      else if (dst[1] == 'r') {
        *pcStack_30 = '\r';
        dst = dst + 1;
        pcStack_30 = pcStack_30 + 1;
      }
      else {
        iVar1 = isdigit((int)dst[1]);
        if (iVar1 == 0) {
          dst = dst + 1;
        }
        else {
          *pcStack_30 = dst[1] * '@' + (dst[2] + -0x30) * '\b' + dst[3] + -0x30;
          dst = dst + 3;
          pcStack_30 = pcStack_30 + 1;
        }
      }
    }
    else {
      *pcStack_30 = *dst;
      pcStack_30 = pcStack_30 + 1;
    }
  }
  *pcStack_30 = '\0';
  return pcVar2;
}

Assistant:

static char *decodeText( const char *src ) {
  int len = 0;
  const char *s = src;
  for ( ; *s; s++, len++ ) {
    if ( *s == '\\' ) {
      if ( isdigit( s[1] ) ) {
        s+=3; 
      } else { 
        s+=1;
      }
    }
  }
  char *dst = (char*)malloc( len+1 ), *d = dst;
  for ( s = src; *s; s++ ) {
    char c = *s;
    if ( c == '\\' ) {
      if ( s[1] == '\\' ) { *d++ = c; s++; }
      else if ( s[1] == 'n' ) { *d++ = '\n'; s++; }
      else if ( s[1] == 'r' ) { *d++ = '\r'; s++; }
      else if ( isdigit( s[1] ) ) { *d++ = ((s[1]-'0')<<6) + ((s[2]-'0')<<3) + (s[3]-'0'); s+=3; }
      else s++; // error
    }
    else
      *d++ = c;
  }
  *d = 0;
  return dst;
}